

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O3

int FlushFrames(WebPAnimEncoder *enc)

{
  WebPMuxError WVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  EncodedFrame *pEVar6;
  undefined8 *puVar7;
  EncodedFrame *pEVar8;
  int iVar9;
  byte bVar10;
  EncodedFrame temp;
  undefined8 auStack_88 [13];
  
  bVar10 = 0;
  if (enc->flush_count_ == 0) {
    sVar3 = enc->count_;
  }
  else {
    sVar2 = enc->start_;
    do {
      pEVar8 = enc->encoded_frames_;
      pEVar6 = pEVar8 + sVar2;
      if (pEVar8[sVar2].is_key_frame_ != 0) {
        pEVar6 = (EncodedFrame *)&pEVar8[sVar2].key_frame_;
      }
      WVar1 = WebPMuxPushFrame(enc->mux_,&pEVar6->sub_frame_,1);
      if (WVar1 != WEBP_MUX_OK) {
        snprintf(enc->error_str_,100,"%s: %d.","ERROR adding frame. WebPMuxError",(ulong)(uint)WVar1
                );
        return 0;
      }
      if ((enc->options_).verbose != 0) {
        FlushFrames_cold_1();
      }
      enc->out_frame_count_ = enc->out_frame_count_ + 1;
      FrameRelease(pEVar8 + sVar2);
      sVar2 = enc->start_ + 1;
      enc->start_ = sVar2;
      sVar5 = enc->flush_count_ - 1;
      enc->flush_count_ = sVar5;
      sVar3 = enc->count_ - 1;
      enc->count_ = sVar3;
      if (enc->keyframe_ != -1) {
        enc->keyframe_ = enc->keyframe_ + -1;
      }
    } while (sVar5 != 0);
  }
  if ((sVar3 == 1) && (sVar3 = enc->start_, sVar3 != 0)) {
    pEVar8 = enc->encoded_frames_;
    pEVar6 = pEVar8;
    puVar7 = auStack_88;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = (pEVar6->sub_frame_).bitstream.bytes;
      pEVar6 = (EncodedFrame *)((long)pEVar6 + (ulong)bVar10 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar9 = (int)sVar3;
    pEVar6 = pEVar8 + iVar9;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pEVar8->sub_frame_).bitstream.bytes = (pEVar6->sub_frame_).bitstream.bytes;
      pEVar6 = (EncodedFrame *)((long)pEVar6 + (ulong)bVar10 * -0x10 + 8);
      pEVar8 = (EncodedFrame *)((long)pEVar8 + (ulong)bVar10 * -0x10 + 8);
    }
    puVar7 = auStack_88;
    pEVar8 = enc->encoded_frames_ + iVar9;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pEVar8->sub_frame_).bitstream.bytes = (uint8_t *)*puVar7;
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
      pEVar8 = (EncodedFrame *)((long)pEVar8 + (ulong)bVar10 * -0x10 + 8);
    }
    FrameRelease(enc->encoded_frames_ + iVar9);
    enc->start_ = 0;
  }
  return 1;
}

Assistant:

static int FlushFrames(WebPAnimEncoder* const enc) {
  while (enc->flush_count_ > 0) {
    WebPMuxError err;
    EncodedFrame* const curr = GetFrame(enc, 0);
    const WebPMuxFrameInfo* const info =
        curr->is_key_frame_ ? &curr->key_frame_ : &curr->sub_frame_;
    assert(enc->mux_ != NULL);
    err = WebPMuxPushFrame(enc->mux_, info, 1);
    if (err != WEBP_MUX_OK) {
      MarkError2(enc, "ERROR adding frame. WebPMuxError", err);
      return 0;
    }
    if (enc->options_.verbose) {
      fprintf(stderr, "INFO: Added frame. offset:%d,%d dispose:%d blend:%d\n",
              info->x_offset, info->y_offset, info->dispose_method,
              info->blend_method);
    }
    ++enc->out_frame_count_;
    FrameRelease(curr);
    ++enc->start_;
    --enc->flush_count_;
    --enc->count_;
    if (enc->keyframe_ != KEYFRAME_NONE) --enc->keyframe_;
  }

  if (enc->count_ == 1 && enc->start_ != 0) {
    // Move enc->start to index 0.
    const int enc_start_tmp = (int)enc->start_;
    EncodedFrame temp = enc->encoded_frames_[0];
    enc->encoded_frames_[0] = enc->encoded_frames_[enc_start_tmp];
    enc->encoded_frames_[enc_start_tmp] = temp;
    FrameRelease(&enc->encoded_frames_[enc_start_tmp]);
    enc->start_ = 0;
  }
  return 1;
}